

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O2

void __thiscall cmXMLWriter::CloseStartElement(cmXMLWriter *this)

{
  if (this->ElementOpen == true) {
    ConditionalLineBreak
              (this,this->BreakAttrib,
               (long)(this->Elements).c.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Elements).c.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    std::operator<<(this->Output,'>');
    this->ElementOpen = false;
  }
  return;
}

Assistant:

void cmXMLWriter::CloseStartElement()
{
  if (this->ElementOpen) {
    this->ConditionalLineBreak(this->BreakAttrib, this->Elements.size());
    this->Output << '>';
    this->ElementOpen = false;
  }
}